

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O0

void __thiscall
SSM::ECUPort::continuousRead(ECUPort *this,Observables *observables,ReadValueCallback *callback)

{
  allocator<std::byte> *this_00;
  allocator<double> *this_01;
  int iVar1;
  size_type sVar2;
  const_reference ppOVar3;
  reference pvVar4;
  value_type vVar5;
  int local_dc;
  int i;
  InvalidChecksum anon_var_0;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_90
  ;
  const_iterator it;
  undefined1 local_80 [8];
  Values values;
  undefined1 local_60 [8];
  Bytes response;
  Bytes local_38;
  ReadValueCallback *local_20;
  ReadValueCallback *callback_local;
  Observables *observables_local;
  ECUPort *this_local;
  
  local_20 = callback;
  callback_local = (ReadValueCallback *)observables;
  observables_local = (Observables *)this;
  buildReadRequest(&local_38,this,observables,true);
  sendRequest(this,&local_38,3);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(&local_38);
  this_00 = (allocator<std::byte> *)
            ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::byte>::allocator(this_00);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_60,0,this_00);
  std::allocator<std::byte>::~allocator
            ((allocator<std::byte> *)
             ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar2 = std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::size
                    ((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_> *)
                     callback_local);
  this_01 = (allocator<double> *)((long)&it._M_current + 7);
  std::allocator<double>::allocator(this_01);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_80,sVar2,this_01);
  std::allocator<double>::~allocator((allocator<double> *)((long)&it._M_current + 7));
  __gnu_cxx::
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
  __normal_iterator(&local_90);
  do {
    readECUPacket((Bytes *)((long)&anon_var_0.super_Exception.m_what.field_2 + 8),this,false);
    std::vector<std::byte,_std::allocator<std::byte>_>::operator=
              ((vector<std::byte,_std::allocator<std::byte>_> *)local_60,
               (vector<std::byte,_std::allocator<std::byte>_> *)
               ((long)&anon_var_0.super_Exception.m_what.field_2 + 8));
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)
               ((long)&anon_var_0.super_Exception.m_what.field_2 + 8));
    local_90._M_current = (byte *)skipToData((Bytes *)local_60);
    for (local_dc = 0;
        sVar2 = std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::size
                          ((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                            *)callback_local), (ulong)(long)local_dc < sVar2;
        local_dc = local_dc + 1) {
      ppOVar3 = std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::
                operator[]((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                            *)callback_local,(long)local_dc);
      vVar5 = (value_type)(*(code *)**(undefined8 **)*ppOVar3)(*ppOVar3,local_90._M_current);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_80,(long)local_dc);
      *pvVar4 = vVar5;
      ppOVar3 = std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::
                operator[]((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                            *)callback_local,(long)local_dc);
      iVar1 = (**(code **)(*(long *)*ppOVar3 + 0x18))();
      __gnu_cxx::
      __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
      operator+=(&local_90,(long)iVar1);
    }
    iVar1 = std::
            function<int_(const_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
            ::operator()(callback,(vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                                   *)callback_local,
                         (vector<double,_std::allocator<double>_> *)local_80);
  } while (iVar1 == 0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_80);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_60);
  return;
}

Assistant:

void ECUPort::continuousRead(const Observables& observables,
			       ReadValueCallback callback) const
  {
    sendRequest(buildReadRequest(observables, true));

    Bytes response(0);
    Values values(observables.size());
    Bytes::const_iterator it;

    while(true)
      {
	try { response = readECUPacket(false);}
	catch(InvalidChecksum) { continue; }
	it = skipToData(response);
	for(int i(0); i< observables.size(); i++)
	  {
	    values[i] = observables[i]->convert(it);
	    it += observables[i]->numBytes();
	  }
	if(callback(observables, values)) return;
      }
  }